

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O3

void secp256k1_dleq_challenge
               (secp256k1_scalar *e,secp256k1_ge *gen2,secp256k1_ge *r1,secp256k1_ge *r2,
               secp256k1_ge *p1,secp256k1_ge *p2)

{
  uchar buf [32];
  uchar auStack_b8 [32];
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x8cc4beac;
  local_98.s[1] = 0x2e011f3f;
  local_98.s[2] = 0x355c75fb;
  local_98.s[3] = 0x3ba6a2c5;
  local_98.s[4] = 0xe96f3aef;
  local_98.s[5] = 0x180530fd;
  local_98.s[6] = 0x94582499;
  local_98.s[7] = 0x577fd564;
  local_98.bytes = 0x40;
  secp256k1_dleq_hash_point(&local_98,p1);
  secp256k1_dleq_hash_point(&local_98,gen2);
  secp256k1_dleq_hash_point(&local_98,p2);
  secp256k1_dleq_hash_point(&local_98,r1);
  secp256k1_dleq_hash_point(&local_98,r2);
  secp256k1_sha256_finalize(&local_98,auStack_b8);
  secp256k1_scalar_set_b32(e,auStack_b8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_dleq_challenge(secp256k1_scalar *e, secp256k1_ge *gen2, secp256k1_ge *r1, secp256k1_ge *r2, secp256k1_ge *p1, secp256k1_ge *p2) {
    unsigned char buf[32];
    secp256k1_sha256 sha;

    secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    secp256k1_dleq_hash_point(&sha, p1);
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, p2);
    secp256k1_dleq_hash_point(&sha, r1);
    secp256k1_dleq_hash_point(&sha, r2);
    secp256k1_sha256_finalize(&sha, buf);

    secp256k1_scalar_set_b32(e, buf, NULL);
}